

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::TextureSwizzle::IntialStateTest::iterate(IntialStateTest *this)

{
  GLenum texture_target;
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  ulong uStack_20;
  GLenum target;
  size_t tex_tgt_idx;
  Functions *gl;
  IntialStateTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x910);
  for (uStack_20 = 0; uStack_20 < 9; uStack_20 = uStack_20 + 1) {
    texture_target = *(GLenum *)(texture_targets + uStack_20 * 0x30 + 0x28);
    (**(code **)(lVar4 + 0xb8))(texture_target,this->m_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0x917);
    verifyValues(this,texture_target);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult IntialStateTest::iterate()
{
	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	for (size_t tex_tgt_idx = 0; tex_tgt_idx < n_texture_targets; ++tex_tgt_idx)
	{
		const glw::GLenum target = texture_targets[tex_tgt_idx].m_target;

		gl.bindTexture(target, m_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		verifyValues(target);

		deinit();
	}

	/* Set result - exceptions are thrown in case of any error */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return STOP;
}